

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::ZoneStackBase::_prepareBlock(ZoneStackBase *this,uint32_t side,size_t initialIndex)

{
  Block *pBVar1;
  Block *pBVar2;
  long in_RDX;
  uint in_ESI;
  long *in_RDI;
  Block *block;
  Block *prev;
  char *in_stack_000003b0;
  int in_stack_000003bc;
  char *in_stack_000003c0;
  ZoneAllocator *in_stack_ffffffffffffffc0;
  Error local_14;
  
  if (*in_RDI == 0) {
    DebugUtils::assertionFailed(in_stack_000003c0,in_stack_000003bc,in_stack_000003b0);
  }
  pBVar1 = (Block *)in_RDI[(ulong)in_ESI + 1];
  if (pBVar1->_start == pBVar1->_end) {
    DebugUtils::assertionFailed(in_stack_000003c0,in_stack_000003bc,in_stack_000003b0);
  }
  pBVar2 = ZoneAllocator::allocT<asmjit::v1_14::ZoneStackBase::Block>
                     (in_stack_ffffffffffffffc0,(size_t)in_RDI);
  if (pBVar2 == (Block *)0x0) {
    local_14 = DebugUtils::errored(1);
  }
  else {
    pBVar2->_link[in_ESI] = (Block *)0x0;
    pBVar2->_link[(in_ESI != 0 ^ 0xffU) & 1] = pBVar1;
    pBVar2->_start = (void *)((long)pBVar2->_link + in_RDX);
    pBVar2->_end = (void *)((long)pBVar2->_link + in_RDX);
    pBVar1->_link[in_ESI] = pBVar2;
    in_RDI[(ulong)in_ESI + 1] = (long)pBVar2;
    local_14 = 0;
  }
  return local_14;
}

Assistant:

Error ZoneStackBase::_prepareBlock(uint32_t side, size_t initialIndex) noexcept {
  ASMJIT_ASSERT(isInitialized());

  Block* prev = _block[side];
  ASMJIT_ASSERT(!prev->empty());

  Block* block = _allocator->allocT<Block>(kBlockSize);
  if (ASMJIT_UNLIKELY(!block))
    return DebugUtils::errored(kErrorOutOfMemory);

  block->_link[ side] = nullptr;
  block->_link[!side] = prev;
  block->_start = (uint8_t*)block + initialIndex;
  block->_end = (uint8_t*)block + initialIndex;

  prev->_link[side] = block;
  _block[side] = block;

  return kErrorOk;
}